

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ray_tracing.cpp
# Opt level: O3

bool dxil_spv::emit_allocate_ray_query(Impl *impl,CallInst *inst)

{
  Set<spv::Capability> *this;
  SPIRVModule *this_00;
  Id IVar1;
  Builder *pBVar2;
  mapped_type *pmVar3;
  CallInst *local_28;
  
  pBVar2 = Converter::Impl::builder(impl);
  this_00 = impl->spirv_module;
  IVar1 = spv::Builder::makeRayQueryType(pBVar2);
  IVar1 = SPIRVModule::create_variable(this_00,StorageClassPrivate,IVar1,(char *)0x0);
  Converter::Impl::rewrite_value(impl,(Value *)inst,IVar1);
  local_28 = inst;
  pmVar3 = std::__detail::
           _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&impl->handle_to_storage_class,(key_type *)&local_28);
  *pmVar3 = StorageClassPrivate;
  pBVar2 = Converter::Impl::builder(impl);
  spv::Builder::addExtension(pBVar2,"SPV_KHR_ray_query");
  local_28._0_4_ = 0x1178;
  this = &pBVar2->capabilities;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)this,(Capability *)&local_28);
  local_28._0_4_ = 0x117e;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)this,(Capability *)&local_28);
  if ((impl->options).opacity_micromap_enabled == true) {
    spv::Builder::addExtension(pBVar2,"SPV_EXT_opacity_micromap");
    local_28 = (CallInst *)CONCAT44(local_28._4_4_,0x1505);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)this,(Capability *)&local_28);
  }
  return true;
}

Assistant:

bool emit_allocate_ray_query(Converter::Impl &impl, const llvm::CallInst *inst)
{
	// TODO: It seems like we can use full variable pointers with RayQuery in DXIL.
	// To implement this, we will need some kind of global "bank" of ray query objects,
	// and allocateRayQuery could assign indices into that global array.
	// Until we actually see this happen in practice, we can just allocate RayQuery objects like this.
	// The return type of allocateRayQuery appears to be i32, so this might be how it's intended to be done ...
	auto &builder = impl.builder();
	spv::Id var_id = impl.spirv_module.create_variable(spv::StorageClassPrivate, builder.makeRayQueryType());
	impl.rewrite_value(inst, var_id);
	impl.handle_to_storage_class[inst] = spv::StorageClassPrivate;
	emit_ray_query_capabilities(impl);
	return true;
}